

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O1

void __thiscall
ProtocolMACEthernet::Transmit
          (ProtocolMACEthernet *this,DataBuffer *buffer,uint8_t *targetMAC,uint16_t type)

{
  ushort uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  
  puVar2 = buffer->Packet;
  buffer->Packet = puVar2 + -0xe;
  buffer->Length = buffer->Length + 0xe;
  sVar3 = PackBytes(puVar2 + -0xe,0,targetMAC,6);
  sVar3 = PackBytes(buffer->Packet,sVar3,this->UnicastAddress,6);
  Pack16(buffer->Packet,sVar3,type);
  uVar1 = buffer->Length;
  while (uVar1 < 0x3c) {
    buffer->Length = uVar1 + 1;
    buffer->Packet[uVar1] = '\0';
    uVar1 = buffer->Length;
  }
  if (this->TxHandler != (DataTransmitHandler)0x0) {
    (*this->TxHandler)(buffer->Packet,(size_t)uVar1);
  }
  if (buffer->Disposable != true) {
    return;
  }
  osQueue::Put(&this->TxBufferQueue,buffer);
  return;
}

Assistant:

void ProtocolMACEthernet::Transmit(DataBuffer* buffer, const uint8_t* targetMAC, uint16_t type)
{
    buffer->Packet -= header_size();
    buffer->Length += header_size();

    size_t offset = 0;
    offset = PackBytes(buffer->Packet, offset, targetMAC, 6);
    offset = PackBytes(buffer->Packet, offset, UnicastAddress, 6);
    offset = Pack16(buffer->Packet, offset, type);

    offset += buffer->Length;
    while (buffer->Length < 60)
    {
        buffer->Packet[buffer->Length++] = 0;
    }

    if (TxHandler)
    {
        TxHandler(buffer->Packet, buffer->Length);
    }

    if (buffer->Disposable)
    {
        TxBufferQueue.Put(buffer);
    }
}